

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

int getIndentation(QString *text)

{
  long lVar1;
  qsizetype qVar2;
  bool local_1a;
  QLatin1Char local_19;
  QChar local_18;
  QChar local_16;
  int local_14;
  QString *pQStack_10;
  int spaces;
  QString *text_local;
  
  local_14 = 0;
  pQStack_10 = text;
  while( true ) {
    local_1a = false;
    if (local_14 < 4) {
      lVar1 = (long)local_14;
      qVar2 = QString::length(pQStack_10);
      local_1a = false;
      if (lVar1 < qVar2) {
        local_16 = QString::at(pQStack_10,(long)local_14);
        QLatin1Char::QLatin1Char(&local_19,' ');
        QChar::QChar(&local_18,local_19);
        local_1a = operator==(local_16,local_18);
      }
    }
    if (local_1a == false) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int getIndentation(const QString &text) {
    int spaces = 0;
    // no more than 3 spaces
    while (spaces < 4 && spaces < text.length() &&
           text.at(spaces) == QLatin1Char(' '))
        ++spaces;
    return spaces;
}